

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindowPrivate::setSizeGripVisible(QMdiSubWindowPrivate *this,bool visible)

{
  long lVar1;
  QList<QSizeGrip_*> *__range1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QList<QSizeGrip_*> list;
  QArrayData *local_48;
  long lStack_40;
  long local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (QArrayData *)0x0;
  lStack_40 = 0;
  local_38 = 0;
  qt_qFindChildren_helper
            (*(undefined8 *)&(this->super_QWidgetPrivate).field_0x8,0,0,&QSizeGrip::staticMetaObject
             ,&local_48,1);
  lVar1 = lStack_40;
  if (local_38 != 0) {
    lVar3 = local_38 << 3;
    lVar2 = 0;
    do {
      (**(code **)(**(long **)(lVar1 + lVar2) + 0x68))(*(long **)(lVar1 + lVar2),visible);
      lVar2 = lVar2 + 8;
    } while (lVar3 != lVar2);
  }
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::setSizeGripVisible(bool visible) const
{
    // See if we can find any size grips
    const QList<QSizeGrip *> sizeGrips = q_func()->findChildren<QSizeGrip *>();
    for (QSizeGrip *grip : sizeGrips)
        grip->setVisible(visible);
}